

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
kratos::EnableStmtVisitor::get_ssa_en_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,EnableStmtVisitor *this,Attribute *attr)

{
  int iVar1;
  long lVar2;
  size_type *psVar3;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  
  if (get_ssa_en[abi:cxx11](kratos::Attribute_const*)::start_pos == '\0') {
    iVar1 = __cxa_guard_acquire(&get_ssa_en[abi:cxx11](kratos::Attribute_const*)::start_pos);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_48,"ssa-en=",(allocator<char> *)(v.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)local_48);
      get_ssa_en::start_pos = (size_type)v._M_dataplus._M_p;
      __cxa_guard_release(&get_ssa_en[abi:cxx11](kratos::Attribute_const*)::start_pos);
    }
  }
  psVar3 = &(this->super_IRVisitor).visited_._M_h._M_element_count;
  lVar2 = std::__cxx11::string::rfind((char *)psVar3,0x221450);
  if (lVar2 == 0) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)psVar3);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::optional<std::string> get_ssa_en(const Attribute* attr) {
        auto const& value_str = attr->value_str;
        constexpr auto en_str = "ssa-en=";
        auto static const start_pos = std::string(en_str).size();
        auto pos = value_str.rfind(en_str);
        if (pos == 0) {
            auto v = value_str.substr(start_pos);
            return v;
        } else {
            return std::nullopt;
        }
    }